

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::BuildWarningMessage_abi_cxx11_
          (string *__return_storage_ptr__,ReplaceInvalidOpcodePass *this,Op opcode)

{
  IRContext *this_00;
  AssemblyGrammar *this_01;
  allocator<char> local_2a;
  undefined1 local_29;
  spv_opcode_desc local_28;
  spv_opcode_desc opcode_info;
  ReplaceInvalidOpcodePass *pRStack_18;
  Op opcode_local;
  ReplaceInvalidOpcodePass *this_local;
  string *message;
  
  opcode_info._4_4_ = opcode;
  pRStack_18 = this;
  this_local = (ReplaceInvalidOpcodePass *)__return_storage_ptr__;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::grammar(this_00);
  AssemblyGrammar::lookupOpcode(this_01,opcode_info._4_4_,&local_28);
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Removing ",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_28->name);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             " instruction because of incompatible execution model.");
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceInvalidOpcodePass::BuildWarningMessage(spv::Op opcode) {
  spv_opcode_desc opcode_info;
  context()->grammar().lookupOpcode(opcode, &opcode_info);
  std::string message = "Removing ";
  message += opcode_info->name;
  message += " instruction because of incompatible execution model.";
  return message;
}